

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::CompilerGLSL::emit_flattened_io_block_struct
          (CompilerGLSL *this,string *basename,SPIRType *type,char *qual,
          SmallVector<unsigned_int,_8UL> *indices)

{
  undefined8 this_00;
  bool bVar1;
  uint32_t uVar2;
  uint *puVar3;
  TypedID *pTVar4;
  CompilerError *this_01;
  size_t sVar5;
  SPIRType *pSVar6;
  uint local_a8;
  uint32_t i;
  uint *index;
  uint *__end1;
  uint *__begin1;
  SmallVector<unsigned_int,_8UL> *__range1;
  SPIRType *member_type;
  undefined1 local_68 [8];
  SmallVector<unsigned_int,_8UL> sub_indices;
  SmallVector<unsigned_int,_8UL> *indices_local;
  char *qual_local;
  SPIRType *type_local;
  string *basename_local;
  CompilerGLSL *this_local;
  
  sub_indices.stack_storage.aligned_char._24_8_ = indices;
  SmallVector<unsigned_int,_8UL>::SmallVector((SmallVector<unsigned_int,_8UL> *)local_68,indices);
  member_type._4_4_ = 0;
  SmallVector<unsigned_int,_8UL>::push_back
            ((SmallVector<unsigned_int,_8UL> *)local_68,(uint *)((long)&member_type + 4));
  this_00 = sub_indices.stack_storage.aligned_char._24_8_;
  __end1 = VectorView<unsigned_int>::begin
                     ((VectorView<unsigned_int> *)sub_indices.stack_storage.aligned_char._24_8_);
  puVar3 = VectorView<unsigned_int>::end((VectorView<unsigned_int> *)this_00);
  __range1 = (SmallVector<unsigned_int,_8UL> *)type;
  for (; __end1 != puVar3; __end1 = __end1 + 1) {
    pTVar4 = (TypedID *)
             VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>::operator[]
                       ((VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                         *)&__range1[2].stack_storage,(ulong)*__end1);
    uVar2 = TypedID::operator_cast_to_unsigned_int(pTVar4);
    __range1 = (SmallVector<unsigned_int,_8UL> *)
               Compiler::get<diligent_spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
  }
  if ((int)__range1->buffer_capacity == 0xf) {
    bVar1 = VectorView<unsigned_int>::empty
                      ((VectorView<unsigned_int> *)((__range1->stack_storage).aligned_char + 8));
    if (!bVar1) {
      this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_01,"Cannot flatten array of structs in I/O blocks.");
      __cxa_throw(this_01,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    local_a8 = 0;
    while( true ) {
      sVar5 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>::size
                        ((VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                          *)&__range1[2].stack_storage);
      if ((uint)sVar5 <= local_a8) break;
      puVar3 = VectorView<unsigned_int>::back((VectorView<unsigned_int> *)local_68);
      *puVar3 = local_a8;
      pTVar4 = (TypedID *)
               VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>::
               operator[]((VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                           *)&__range1[2].stack_storage,(ulong)local_a8);
      uVar2 = TypedID::operator_cast_to_unsigned_int(pTVar4);
      pSVar6 = Compiler::get<diligent_spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
      if (pSVar6->basetype == Struct) {
        emit_flattened_io_block_struct
                  (this,basename,type,qual,(SmallVector<unsigned_int,_8UL> *)local_68);
      }
      else {
        emit_flattened_io_block_member
                  (this,basename,type,qual,(SmallVector<unsigned_int,_8UL> *)local_68);
      }
      local_a8 = local_a8 + 1;
    }
    SmallVector<unsigned_int,_8UL>::~SmallVector((SmallVector<unsigned_int,_8UL> *)local_68);
    return;
  }
  __assert_fail("member_type->basetype == SPIRType::Struct",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Cross/spirv_glsl.cpp"
                ,0xa5a,
                "void diligent_spirv_cross::CompilerGLSL::emit_flattened_io_block_struct(const std::string &, const SPIRType &, const char *, const SmallVector<uint32_t> &)"
               );
}

Assistant:

void CompilerGLSL::emit_flattened_io_block_struct(const std::string &basename, const SPIRType &type, const char *qual,
                                                  const SmallVector<uint32_t> &indices)
{
	auto sub_indices = indices;
	sub_indices.push_back(0);

	const SPIRType *member_type = &type;
	for (auto &index : indices)
		member_type = &get<SPIRType>(member_type->member_types[index]);

	assert(member_type->basetype == SPIRType::Struct);

	if (!member_type->array.empty())
		SPIRV_CROSS_THROW("Cannot flatten array of structs in I/O blocks.");

	for (uint32_t i = 0; i < uint32_t(member_type->member_types.size()); i++)
	{
		sub_indices.back() = i;
		if (get<SPIRType>(member_type->member_types[i]).basetype == SPIRType::Struct)
			emit_flattened_io_block_struct(basename, type, qual, sub_indices);
		else
			emit_flattened_io_block_member(basename, type, qual, sub_indices);
	}
}